

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

void twiddle(fft_data *vec,int N,int radix)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  vec->re = 1.0;
  vec->im = 0.0;
  pdVar1 = &vec[1].im;
  for (lVar2 = 1; lVar2 < N / radix; lVar2 = lVar2 + 1) {
    dVar3 = (double)(int)lVar2 * (6.283185307179586 / (double)N);
    dVar4 = cos(dVar3);
    ((fft_data *)(pdVar1 + -1))->re = dVar4;
    dVar3 = sin(dVar3);
    *pdVar1 = -dVar3;
    pdVar1 = pdVar1 + 2;
  }
  return;
}

Assistant:

void twiddle(fft_data *vec,int N, int radix) {
	int K,KL;
	fft_type theta,theta2;
	theta = PI2/N;
	KL = N/radix;
	vec[0].re = 1.0;
	vec[0].im = 0.0;

	for (K = 1; K < KL;K++) {
		theta2 = theta * K;
		vec[K].re = cos(theta2);
		vec[K].im = -sin(theta2);
	}

}